

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O3

bool tinyobj::exportFaceGroupToShape
               (shape_t *shape,
               map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
               *vertexCache,vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,
               vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               *faceGroup,vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,
               int material_id,string *name,bool clearCache,uint flags,string *err)

{
  vector<float,_std::allocator<float>_> *normals;
  mesh_t *positions;
  vector<int,_std::allocator<int>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined8 uVar1;
  pointer pvVar2;
  pointer pvVar3;
  iterator iVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pfVar7;
  pointer paVar8;
  bool bVar9;
  pointer paVar10;
  pointer paVar11;
  pointer paVar12;
  undefined1 auVar13 [16];
  string *psVar14;
  pointer pvVar15;
  uint *puVar16;
  ostream *poVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  iterator iVar21;
  ulong uVar22;
  ulong uVar23;
  shape_t *psVar24;
  long lVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined3 in_stack_00000021;
  undefined4 in_stack_0000002c;
  uchar local_285;
  uint v;
  shape_t *local_280;
  uint v2;
  uint v1;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_270;
  vector<float,_std::allocator<float>_> *local_268;
  vertex_index i2;
  vertex_index i1;
  long local_200 [2];
  pointer local_1f0;
  pointer local_1e8;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  *local_1e0;
  ulong local_1d8;
  pointer local_1d0;
  long local_1c8;
  long local_1c0;
  vertex_index i0;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = (faceGroup->
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (faceGroup->
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1e8 != local_1f0) {
    normals = &(shape->mesh).normals;
    positions = &shape->mesh;
    uVar22 = 0;
    local_270 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&(shape->mesh).indices;
    local_268 = &(shape->mesh).texcoords;
    this = &(shape->mesh).material_ids;
    this_00 = &(shape->mesh).num_vertices;
    pvVar15 = local_1e8;
    local_280 = shape;
    local_1e0 = faceGroup;
    do {
      psVar24 = local_280;
      pvVar15 = pvVar15 + uVar22;
      pvVar2 = (pvVar15->
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
               _M_impl.super__Vector_impl_data._M_start;
      i0.vn_idx = pvVar2->vn_idx;
      i0.v_idx = pvVar2->v_idx;
      i0.vt_idx = pvVar2->vt_idx;
      i1.v_idx = -1;
      i1.vt_idx = -1;
      i1.vn_idx = -1;
      pvVar2 = (pvVar15->
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
               _M_impl.super__Vector_impl_data._M_start;
      i2.vn_idx = pvVar2[1].vn_idx;
      i2.v_idx = pvVar2[1].v_idx;
      i2.vt_idx = pvVar2[1].vt_idx;
      pvVar2 = (pvVar15->
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = (pvVar15->
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar23 = ((long)pvVar2 - (long)pvVar3 >> 2) * -0x5555555555555555;
      local_1d8 = uVar22;
      if ((_clearCache & 1) == 0) {
        if (pvVar2 != pvVar3) {
          lVar25 = uVar23 + (uVar23 == 0);
          lVar20 = 0;
          do {
            v = updateVertex(vertexCache,&positions->positions,normals,local_268,in_positions,
                             in_normals,in_texcoords,
                             (vertex_index *)
                             ((long)&((pvVar15->
                                      super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->v_idx + lVar20));
            iVar21._M_current =
                 (psVar24->mesh).indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar21._M_current ==
                (psVar24->mesh).indices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_270,iVar21,&v);
            }
            else {
              *iVar21._M_current = v;
              (psVar24->mesh).indices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar21._M_current + 1;
            }
            lVar20 = lVar20 + 0xc;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
        v = CONCAT31(v._1_3_,(char)uVar23);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (this_00,(uchar *)&v);
        iVar4._M_current =
             (psVar24->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (psVar24->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)this,iVar4,&material_id);
        }
        else {
          *iVar4._M_current = material_id;
          (psVar24->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      else if (2 < uVar23) {
        lVar20 = uVar23 - 2;
        lVar25 = 0x18;
        local_1d0 = pvVar15;
        do {
          i1.vn_idx = i2.vn_idx;
          i1.v_idx = i2.v_idx;
          i1.vt_idx = i2.vt_idx;
          pvVar2 = (pvVar15->
                   super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          i2._0_8_ = *(undefined8 *)((long)&pvVar2->v_idx + lVar25);
          i2.vn_idx = *(int *)((long)&pvVar2->vn_idx + lVar25);
          local_1c8 = lVar25;
          local_1c0 = lVar20;
          v = updateVertex(vertexCache,&positions->positions,normals,local_268,in_positions,
                           in_normals,in_texcoords,&i0);
          v1 = updateVertex(vertexCache,&positions->positions,normals,local_268,in_positions,
                            in_normals,in_texcoords,&i1);
          v2 = updateVertex(vertexCache,&positions->positions,normals,local_268,in_positions,
                            in_normals,in_texcoords,&i2);
          psVar24 = local_280;
          iVar21._M_current =
               (local_280->mesh).indices.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar16 = (local_280->mesh).indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (iVar21._M_current == puVar16) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_270,iVar21,&v);
            iVar21._M_current =
                 (psVar24->mesh).indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar16 = (psVar24->mesh).indices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar21._M_current = v;
            iVar21._M_current = iVar21._M_current + 1;
            (local_280->mesh).indices.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar21._M_current;
          }
          lVar20 = local_1c0;
          pvVar15 = local_1d0;
          if (iVar21._M_current == puVar16) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_270,iVar21,&v1);
            iVar21._M_current =
                 (psVar24->mesh).indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar16 = (psVar24->mesh).indices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar21._M_current = v1;
            iVar21._M_current = iVar21._M_current + 1;
            (psVar24->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar21._M_current;
          }
          if (iVar21._M_current == puVar16) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_270,iVar21,&v2);
          }
          else {
            *iVar21._M_current = v2;
            (psVar24->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar21._M_current + 1;
          }
          local_285 = '\x03';
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,&local_285);
          iVar4._M_current =
               (psVar24->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (psVar24->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)this,iVar4,&material_id);
          }
          else {
            *iVar4._M_current = material_id;
            (psVar24->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          lVar25 = local_1c8 + 0xc;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      psVar24 = local_280;
      psVar14 = name;
      pvVar15 = (local_1e0->
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar22 = local_1d8 + 1;
    } while (uVar22 < (ulong)(((long)(local_1e0->
                                     super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >>
                              3) * -0x5555555555555555));
    if (((_clearCache & 2) != 0) &&
       ((local_280->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_280->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      puVar5 = (local_280->mesh).indices.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = (local_280->mesh).indices.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar22 = (long)puVar5 - (long)puVar6 >> 2;
      if (uVar22 * -0x5555555555555555 < 0x5555555555555556) {
        std::vector<float,_std::allocator<float>_>::resize
                  (normals,(long)(local_280->mesh).positions.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(local_280->mesh).positions.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2);
        auVar13 = _DAT_00111030;
        if (puVar5 != puVar6) {
          uVar23 = 0;
          do {
            puVar5 = (psVar24->mesh).indices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar7 = (psVar24->mesh).positions.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar18 = (ulong)(puVar5[uVar23] * 3);
            uVar19 = (ulong)(puVar5[uVar23 + 2] * 3);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = *(ulong *)(pfVar7 + uVar18 + 1);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = *(ulong *)(pfVar7 + (ulong)(puVar5[uVar23 + 1] * 3) + 1);
            auVar32 = vsubps_avx(auVar32,auVar27);
            auVar27 = vpermt2ps_avx512vl(auVar27,auVar13,ZEXT416((uint)pfVar7[uVar18]));
            auVar30 = vinsertps_avx(ZEXT416((uint)pfVar7[uVar19 + 2]),ZEXT416((uint)pfVar7[uVar19]),
                                    0x10);
            auVar30 = vsubps_avx(auVar30,auVar27);
            auVar29 = ZEXT416((uint)(pfVar7[puVar5[uVar23 + 1] * 3] - pfVar7[uVar18]));
            auVar27 = vpermt2ps_avx512vl(auVar32,auVar13,auVar29);
            auVar33 = ZEXT416((uint)(pfVar7[uVar19 + 1] - (float)*(ulong *)(pfVar7 + uVar18 + 1)));
            auVar28 = vpermt2ps_avx512vl(auVar30,SUB6416(ZEXT464(4),0),auVar33);
            auVar31._0_4_ = auVar28._0_4_ * auVar27._0_4_;
            auVar31._4_4_ = auVar28._4_4_ * auVar27._4_4_;
            auVar31._8_4_ = auVar28._8_4_ * auVar27._8_4_;
            auVar31._12_4_ = auVar28._12_4_ * auVar27._12_4_;
            auVar27 = vfmsub231ps_fma(auVar31,auVar32,auVar30);
            auVar30 = vmovshdup_avx(auVar30);
            auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar32._0_4_)),auVar29,auVar33
                                     );
            auVar30._0_4_ = auVar27._0_4_ * auVar27._0_4_;
            auVar30._4_4_ = auVar27._4_4_ * auVar27._4_4_;
            auVar30._8_4_ = auVar27._8_4_ * auVar27._8_4_;
            auVar30._12_4_ = auVar27._12_4_ * auVar27._12_4_;
            auVar30 = vmovshdup_avx(auVar30);
            auVar30 = vfmadd231ss_fma(auVar30,auVar27,auVar27);
            auVar30 = vfmadd231ss_fma(auVar30,auVar32,auVar32);
            auVar30 = vsqrtss_avx(auVar30,auVar30);
            fVar26 = auVar30._0_4_;
            auVar28._4_4_ = fVar26;
            auVar28._0_4_ = fVar26;
            auVar28._8_4_ = fVar26;
            auVar28._12_4_ = fVar26;
            bVar9 = fVar26 != 1.0;
            auVar30 = vdivps_avx(auVar27,auVar28);
            if ((!bVar9) && (!NAN(fVar26))) {
              auVar30 = auVar27;
            }
            pfVar7 = (local_280->mesh).normals.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar1 = vmovlps_avx(auVar30);
            *(undefined8 *)(pfVar7 + uVar18) = uVar1;
            fVar26 = (float)((uint)bVar9 * (int)(auVar32._0_4_ / fVar26) +
                            (uint)!bVar9 * (int)auVar32._0_4_);
            pfVar7[uVar18 + 2] = fVar26;
            pfVar7 = (local_280->mesh).normals.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar18 = (ulong)((local_280->mesh).indices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar23 + 1] * 3);
            uVar1 = vmovlps_avx(auVar30);
            *(undefined8 *)(pfVar7 + uVar18) = uVar1;
            pfVar7[uVar18 + 2] = fVar26;
            pfVar7 = (local_280->mesh).normals.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar20 = uVar23 + 2;
            uVar23 = uVar23 + 3;
            uVar18 = (ulong)((local_280->mesh).indices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar20] * 3);
            uVar1 = vmovlps_avx(auVar30);
            *(undefined8 *)(pfVar7 + uVar18) = uVar1;
            pfVar7[uVar18 + 2] = fVar26;
            psVar24 = local_280;
          } while (uVar23 < uVar22);
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&i0);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"WARN: The shape ",0x10);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,
                   " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object."
                   ,0x98);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)CONCAT44(in_stack_0000002c,flags),i1._0_8_);
        if ((long *)i1._0_8_ != local_200) {
          operator_delete((void *)i1._0_8_,local_200[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&i0);
        std::ios_base::~ios_base(local_138);
        psVar24 = local_280;
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar24);
    paVar10 = (psVar24->mesh).tags.
              super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar11 = (psVar24->mesh).tags.
              super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    paVar8 = (psVar24->mesh).tags.
             super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    paVar12 = (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    (psVar24->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl
    .super__Vector_impl_data._M_start =
         (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (psVar24->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl
    .super__Vector_impl_data._M_finish = paVar12;
    (psVar24->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
    super__Vector_impl_data._M_start = paVar10;
    (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = paVar11;
    (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = paVar8;
    std::
    _Rb_tree<tinyobj::vertex_index,_std::pair<const_tinyobj::vertex_index,_unsigned_int>,_std::_Select1st<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
    ::clear(&vertexCache->_M_t);
  }
  return local_1e8 != local_1f0;
}

Assistant:

static bool exportFaceGroupToShape(
    shape_t &shape, std::map<vertex_index, unsigned int> vertexCache,
    const std::vector<float> &in_positions,
    const std::vector<float> &in_normals,
    const std::vector<float> &in_texcoords,
    const std::vector<std::vector<vertex_index> > &faceGroup,
    std::vector<tag_t> &tags, const int material_id, const std::string &name,
    bool clearCache, unsigned int flags, std::string& err ) {
  if (faceGroup.empty()) {
    return false;
  }

  bool triangulate( ( flags & triangulation ) == triangulation );
  bool normals_calculation( ( flags & calculate_normals ) == calculate_normals );

  // Flatten vertices and indices
  for (size_t i = 0; i < faceGroup.size(); i++) {
    const std::vector<vertex_index> &face = faceGroup[i];

    vertex_index i0 = face[0];
    vertex_index i1(-1);
    vertex_index i2 = face[1];

    size_t npolys = face.size();

    if (triangulate) {

      // Polygon -> triangle fan conversion
      for (size_t k = 2; k < npolys; k++) {
        i1 = i2;
        i2 = face[k];

        unsigned int v0 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i0);
        unsigned int v1 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i1);
        unsigned int v2 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i2);

        shape.mesh.indices.push_back(v0);
        shape.mesh.indices.push_back(v1);
        shape.mesh.indices.push_back(v2);

        shape.mesh.num_vertices.push_back(3);
        shape.mesh.material_ids.push_back(material_id);
      }
    } else {

      for (size_t k = 0; k < npolys; k++) {
        unsigned int v =
            updateVertex(vertexCache, shape.mesh.positions, shape.mesh.normals,
                         shape.mesh.texcoords, in_positions, in_normals,
                         in_texcoords, face[k]);

        shape.mesh.indices.push_back(v);
      }

      shape.mesh.num_vertices.push_back(static_cast<unsigned char>(npolys));
      shape.mesh.material_ids.push_back(material_id); // per face
    }
  }

  if (normals_calculation && shape.mesh.normals.empty()) {
	  const size_t nIndexs = shape.mesh.indices.size();
	  if (nIndexs % 3 == 0) {
		  shape.mesh.normals.resize(shape.mesh.positions.size());
		  for (size_t iIndices = 0; iIndices < nIndexs; iIndices += 3) {
			  float3 v1, v2, v3;
			  memcpy(&v1, &shape.mesh.positions[shape.mesh.indices[iIndices] * 3], sizeof(float3));
			  memcpy(&v2, &shape.mesh.positions[shape.mesh.indices[iIndices + 1] * 3], sizeof(float3));
			  memcpy(&v3, &shape.mesh.positions[shape.mesh.indices[iIndices + 2] * 3], sizeof(float3));

			  float3 v12(v1, v2);
			  float3 v13(v1, v3);

			  float3 normal = v12.crossproduct(v13);
			  normal.normalize();

			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 1] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 2] * 3], &normal, sizeof(float3));
		  }
	  } else {

		  std::stringstream ss;
		  ss << "WARN: The shape " << name << " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object." << std::endl;
		  err += ss.str();
	  }
  }

  shape.name = name;
  shape.mesh.tags.swap(tags);

  if (clearCache)
    vertexCache.clear();

  return true;
}